

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumbfile.c
# Opt level: O3

uint32 dumbfile_cgetul(DUMBFILE *f)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  
  lVar2 = f->pos;
  uVar3 = 0;
  while( true ) {
    if (lVar2 < 0) {
      return 0xffffffff;
    }
    uVar1 = (*f->dfs->getc)(f->file);
    if ((int)uVar1 < 0) break;
    lVar2 = f->pos + 1;
    f->pos = lVar2;
    uVar3 = uVar3 << 7 | uVar1 & 0x7f;
    if (-1 < (char)uVar1) {
      return uVar3;
    }
  }
  f->pos = -1;
  return uVar1;
}

Assistant:

uint32 DUMBEXPORT dumbfile_cgetul(DUMBFILE *f)
{
	uint32 rv = 0;
	int v;

	do {
		v = dumbfile_getc(f);

		if (v < 0)
			return v;

		rv <<= 7;
		rv |= v & 0x7F;
	} while (v & 0x80);

	return rv;
}